

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O1

ON_PointGrid * __thiscall ON_PointGrid::operator=(ON_PointGrid *this,ON_PointGrid *src)

{
  double *pdVar1;
  int iVar2;
  ON_3dPoint *pOVar3;
  ON_3dPoint *pOVar4;
  double dVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (this != src) {
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    iVar7 = src->m_point_count[0];
    this->m_point_count[0] = iVar7;
    iVar2 = src->m_point_count[1];
    this->m_point_count[1] = iVar2;
    this->m_point_stride0 = iVar2;
    uVar6 = iVar2 * iVar7;
    if ((uint)(this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_capacity < uVar6) {
      ON_SimpleArray<ON_3dPoint>::SetCapacity
                (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,(long)(int)uVar6);
    }
    uVar6 = this->m_point_count[1] * this->m_point_count[0];
    if ((-1 < (int)uVar6) &&
       ((int)uVar6 <= (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_capacity)) {
      (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_count = uVar6;
    }
    if (0 < (int)uVar6) {
      if (this->m_point_stride0 == src->m_point_stride0) {
        memcpy((this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a,
               (src->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a,(ulong)uVar6 * 0x18);
      }
      else if (0 < this->m_point_count[0]) {
        iVar7 = 0;
        do {
          if (0 < this->m_point_count[1]) {
            lVar8 = 0;
            lVar9 = 0;
            do {
              lVar10 = (long)src->m_point_stride0 * (long)iVar7;
              pOVar3 = (src->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a;
              pOVar4 = (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a;
              lVar11 = (long)this->m_point_stride0 * (long)iVar7 + lVar9;
              pOVar4[lVar11].z = *(double *)((long)&pOVar3[lVar10].z + lVar8);
              pdVar1 = (double *)((long)&pOVar3[lVar10].x + lVar8);
              dVar5 = pdVar1[1];
              pOVar4 = pOVar4 + lVar11;
              pOVar4->x = *pdVar1;
              pOVar4->y = dVar5;
              lVar9 = lVar9 + 1;
              lVar8 = lVar8 + 0x18;
            } while (lVar9 < this->m_point_count[1]);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < this->m_point_count[0]);
      }
    }
  }
  return this;
}

Assistant:

ON_PointGrid& ON_PointGrid::operator=( const ON_PointGrid& src )
{
  if ( this != &src ) {
    ON_Geometry::operator=(src);
    m_point_count[0] = src.m_point_count[0];
    m_point_count[1] = src.m_point_count[1];
    m_point_stride0 = m_point_count[1];
    m_point.Reserve(PointCount());
    m_point.SetCount(PointCount());
    if ( PointCount() > 0 ) {
      // copy cv array
      if ( m_point_stride0 == src.m_point_stride0 ) {
        memcpy( m_point.Array(), src.m_point.Array(), PointCount()*sizeof(ON_3dPoint) );
      }
      else {
        int i, j;
        for ( i = 0; i < m_point_count[0]; i++ ) for ( j = 0; j < m_point_count[1]; j++ ) {
          m_point[i*m_point_stride0+j] = src[i][j];
        }
      }
    }
  }
  return *this;
}